

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O0

ssize_t __thiscall
pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::splice
          (chunked_sequence<int,_2UL,_4UL,_4UL> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  bool bVar1;
  undefined7 extraout_var;
  size_type sVar2;
  list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
  *plVar3;
  undefined4 in_register_00000034;
  uint in_stack_ffffffffffffffc8;
  iterator local_28;
  _List_const_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> local_20;
  chunked_sequence<int,_2UL,_4UL,_4UL> *local_18;
  chunked_sequence<int,_2UL,_4UL,_4UL> *other_local;
  chunked_sequence<int,_2UL,_4UL,_4UL> *this_local;
  
  local_18 = (chunked_sequence<int,_2UL,_4UL,_4UL> *)CONCAT44(in_register_00000034,__fdin);
  other_local = this;
  bVar1 = empty(local_18);
  plVar3 = (list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
            *)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    bVar1 = empty(this);
    if (bVar1) {
      sVar2 = size(local_18);
      this->size_ = sVar2;
      plVar3 = std::__cxx11::
               list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
               ::operator=(&this->chunks_,&local_18->chunks_);
    }
    else {
      sVar2 = size(local_18);
      this->size_ = sVar2 + this->size_;
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
           ::end(&this->chunks_);
      std::_List_const_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>::
      _List_const_iterator(&local_20,&local_28);
      plVar3 = (list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
                *)std::__cxx11::
                  list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
                  ::splice(&this->chunks_,(int)local_20._M_node,(__off64_t *)local_18,__fdout,
                           __offout,__len,in_stack_ffffffffffffffc8);
    }
  }
  return (ssize_t)plVar3;
}

Assistant:

void splice (chunked_sequence && other) {
            // If the other CV is empty then do nothing.
            if (other.empty ()) {
                return;
            }
            // If this CV is empty then we need to replace the pre-allocated chunk rather than
            // splice onto the end of our chunk list.
            if (empty ()) {
                size_ = other.size ();
                chunks_ = std::move (other.chunks_);
                return;
            }
            size_ += other.size ();
            chunks_.splice (chunks_.end (), std::move (other.chunks_));
        }